

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

double hdr_stddev(hdr_histogram *h)

{
  long lVar1;
  char cVar2;
  int64_t iVar3;
  double dVar4;
  hdr_iter iter;
  double local_a8;
  hdr_histogram *local_98;
  undefined4 local_90;
  int64_t local_88;
  long local_80;
  undefined8 uStack_78;
  int64_t local_70;
  undefined8 uStack_68;
  undefined8 local_50;
  undefined8 uStack_48;
  code *local_20;
  
  dVar4 = hdr_mean(h);
  local_90 = 0xffffffff;
  local_88 = h->total_count;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_20 = all_values_iter_next;
  local_a8 = 0.0;
  local_98 = h;
  while (cVar2 = (*local_20)(&local_98), lVar1 = local_80, cVar2 != '\0') {
    if (local_80 != 0) {
      iVar3 = hdr_median_equivalent_value(h,local_70);
      local_a8 = local_a8 + (double)lVar1 * ((double)iVar3 - dVar4) * ((double)iVar3 - dVar4);
    }
  }
  local_a8 = local_a8 / (double)h->total_count;
  if (local_a8 < 0.0) {
    local_a8 = sqrt(local_a8);
  }
  else {
    local_a8 = SQRT(local_a8);
  }
  return local_a8;
}

Assistant:

double hdr_stddev(const struct hdr_histogram* h)
{
    double mean = hdr_mean(h);
    double geometric_dev_total = 0.0;

    struct hdr_iter iter;
    hdr_iter_init(&iter, h);

    while (hdr_iter_next(&iter))
    {
        if (0 != iter.count)
        {
            double dev = (hdr_median_equivalent_value(h, iter.value) * 1.0) - mean;
            geometric_dev_total += (dev * dev) * iter.count;
        }
    }

    return sqrt(geometric_dev_total / h->total_count);
}